

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastrender.h
# Opt level: O1

void __thiscall
SQCompilation::RenderVisitor::visitDoWhileStatement(RenderVisitor *this,DoWhileStatement *loop)

{
  uint uVar1;
  ulong uVar2;
  
  OutputStream::writeString(this->_out,"DO");
  this->_indent = this->_indent + 2;
  (*(this->super_Visitor)._vptr_Visitor[0x19])(this,loop);
  uVar2 = this->_indent - 2;
  this->_indent = uVar2;
  if (0 < (int)uVar2) {
    do {
      OutputStream::writeInt8(this->_out,' ');
      uVar1 = (int)uVar2 - 1;
      uVar2 = (ulong)uVar1;
    } while (uVar1 != 0);
  }
  OutputStream::writeString(this->_out,"WHILE (");
  OutputStream::writeChar(this->_out,'\n');
  Node::visit<SQCompilation::RenderVisitor>(&loop->_cond->super_Node,this);
  OutputStream::writeChar(this->_out,')');
  return;
}

Assistant:

virtual void visitDoWhileStatement(DoWhileStatement *loop) {
        _out->writeString("DO");

        _indent += 2;
        visitLoopStatement(loop);
        _indent -= 2;

        indent(_indent);
        _out->writeString("WHILE (");
        newLine();
        loop->condition()->visit(this);
        _out->writeChar(')');
    }